

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

TreeEnsembleParameters_TreeNode * __thiscall
CoreML::TreeEnsembleBase::_getNode
          (TreeEnsembleBase *this,size_t treeId,size_t nodeId,bool is_setup_routine)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  Type *pTVar4;
  ostream *poVar5;
  logic_error *plVar6;
  _Base_ptr p_Var7;
  const_iterator __position;
  long lVar8;
  _Alloc_node __an;
  ostringstream ss;
  _Alloc_node local_1c8 [4];
  pair<const_std::pair<unsigned_long,_unsigned_long>,_int> local_1a8 [15];
  
  p_Var3 = (this->_nodeId_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->_nodeId_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var1->_M_header;
  __position._M_node = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if ((*(ulong *)(p_Var3 + 1) < treeId) ||
         ((lVar8 = 0x10, __position._M_node = p_Var3, *(ulong *)(p_Var3 + 1) <= treeId &&
          (p_Var3[1]._M_parent < nodeId)))) {
        lVar8 = 0x18;
        __position._M_node = p_Var7;
      }
      p_Var3 = *(_Base_ptr *)((long)&p_Var3->_M_color + lVar8);
      p_Var7 = __position._M_node;
    } while (p_Var3 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)__position._M_node != p_Var1) &&
        (*(size_t *)(__position._M_node + 1) == treeId)) &&
       (__position._M_node[1]._M_parent == (_Base_ptr)nodeId)) {
      if (is_setup_routine) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Setup routine called multiple times for treeId=",0x2f);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", nodeID=",9);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::logic_error::logic_error(plVar6,(string *)local_1c8);
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                         (&(this->tree_parameters->nodes_).super_RepeatedPtrFieldBase,
                          *(int *)&__position._M_node[1]._M_left);
      return pTVar4;
    }
  }
  if (!is_setup_routine) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Setup routine not called yet for node with treeId=",0x32);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", nodeID=",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::logic_error::logic_error(plVar6,(string *)local_1c8);
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  iVar2 = (this->tree_parameters->nodes_).super_RepeatedPtrFieldBase.current_size_;
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                     (&(this->tree_parameters->nodes_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar4->treeid_ = treeId;
  pTVar4->nodeid_ = nodeId;
  local_1c8[0]._M_t = &(this->_nodeId_map)._M_t;
  local_1a8[0].first.first = treeId;
  local_1a8[0].first.second = nodeId;
  local_1a8[0].second = iVar2;
  std::
  _Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Select1st<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>,std::less<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>>
  ::
  _M_insert_unique_<std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Select1st<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>,std::less<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>>::_Alloc_node>
            ((_Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Select1st<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>,std::less<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>>
              *)&this->_nodeId_map,__position,local_1a8,local_1c8);
  return pTVar4;
}

Assistant:

Specification::TreeEnsembleParameters_TreeNode& TreeEnsembleBase::_getNode(size_t treeId, size_t nodeId, bool is_setup_routine) {
        auto it = _nodeId_map.lower_bound({treeId, nodeId});

        if(it == _nodeId_map.end() || it->first != std::make_pair(treeId, nodeId)) {
            if(!is_setup_routine) {
                std::ostringstream ss;
                ss << "Setup routine not called yet for node with treeId=" << treeId << ", nodeID=" << nodeId << ".";
                throw std::logic_error(ss.str());
            }

            int new_node_index = tree_parameters->nodes_size();
            Specification::TreeEnsembleParameters_TreeNode* newNode = tree_parameters->add_nodes();
            newNode->set_treeid(treeId);
            newNode->set_nodeid(nodeId);
            _nodeId_map.insert(it, {{treeId, nodeId}, new_node_index});
            return *newNode;
        } else {
            if(is_setup_routine) {
                std::ostringstream ss;
                ss << "Setup routine called multiple times for treeId=" << treeId << ", nodeID=" << nodeId << ".";
                throw std::logic_error(ss.str());
            }
            return *(tree_parameters->mutable_nodes(it->second));
        }
    }